

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O2

gdImagePtr gdImageCreateFromGdPtr(int size,void *data)

{
  gdIOCtx *in;
  gdImagePtr pgVar1;
  
  in = gdNewDynamicCtxEx(size,data,0);
  if (in == (gdIOCtx *)0x0) {
    pgVar1 = (gdImagePtr)0x0;
  }
  else {
    pgVar1 = gdImageCreateFromGdCtx(in);
    (*in->gd_free)(in);
  }
  return pgVar1;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGdPtr (int size, void *data)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewDynamicCtxEx (size, data, 0);
	if(!in)
		return 0;
	im = gdImageCreateFromGdCtx (in);
	in->gd_free (in);
	return im;
}